

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

_Bool ggml_graph_find(ggml_cgraph *cgraph,ggml_tensor *node)

{
  int i;
  ggml_tensor *node_local;
  ggml_cgraph *cgraph_local;
  _Bool local_1;
  
  if (cgraph == (ggml_cgraph *)0x0) {
    local_1 = true;
  }
  else {
    for (i = 0; i < cgraph->n_nodes; i = i + 1) {
      if (cgraph->nodes[i] == node) {
        return true;
      }
    }
    local_1 = false;
  }
  return local_1;
}

Assistant:

static bool ggml_graph_find(const struct ggml_cgraph * cgraph, const struct ggml_tensor * node) {
    if (cgraph == NULL) {
        return true;
    }

    for (int i = 0; i < cgraph->n_nodes; i++) {
        if (cgraph->nodes[i] == node) {
            return true;
        }
    }

    return false;
}